

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPo.c
# Opt level: O2

Vec_Wec_t * Gia_PolynGetResult(Hsh_VecMan_t *pHashC,Hsh_VecMan_t *pHashM,Vec_Int_t *vCoefs)

{
  int *piVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int i;
  Vec_Int_t *pVVar5;
  Vec_Wec_t *p;
  Vec_Int_t *pVVar6;
  Vec_Wec_t *p_00;
  Vec_Int_t *pVVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  
  iVar9 = 0;
  iVar10 = 0;
  for (iVar11 = 0; iVar11 < vCoefs->nSize; iVar11 = iVar11 + 1) {
    iVar3 = Vec_IntEntry(vCoefs,iVar11);
    if (iVar3 != 0) {
      pVVar5 = Hsh_VecReadEntry(pHashC,iVar3);
      iVar4 = Vec_IntEntry(pVVar5,0);
      iVar3 = -iVar4;
      if (0 < iVar4) {
        iVar3 = iVar4;
      }
      if (iVar9 <= iVar3) {
        iVar9 = iVar3;
      }
      iVar10 = iVar10 + 1;
    }
  }
  p = Vec_WecStart(iVar9 + 1);
  for (iVar9 = 0; iVar9 < vCoefs->nSize; iVar9 = iVar9 + 1) {
    iVar11 = Vec_IntEntry(vCoefs,iVar9);
    if (iVar11 != 0) {
      pVVar5 = Hsh_VecReadEntry(pHashC,iVar11);
      iVar4 = Vec_IntEntry(pVVar5,0);
      iVar3 = -iVar4;
      if (0 < iVar4) {
        iVar3 = iVar4;
      }
      pVVar5 = Vec_WecEntry(p,iVar3);
      pVVar6 = Hsh_VecReadEntry(pHashM,iVar9);
      iVar3 = -1;
      if (pVVar6->nSize != 0) {
        iVar3 = Vec_IntEntry(pVVar6,0);
      }
      Vec_IntPush(pVVar5,iVar11);
      Vec_IntPush(pVVar5,iVar9);
      Vec_IntPush(pVVar5,iVar3);
    }
  }
  p_00 = Vec_WecAlloc(iVar10 * 2);
  iVar9 = p->nSize;
  iVar11 = 0;
  if (iVar9 < 1) {
    iVar9 = 0;
  }
  do {
    if (iVar11 == iVar9) {
      if (p_00->nSize != iVar10 * 2) {
        __assert_fail("Vec_WecSize(vPolyn) == 2*nNonConst",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecPo.c"
                      ,0x17c,
                      "Vec_Wec_t *Gia_PolynGetResult(Hsh_VecMan_t *, Hsh_VecMan_t *, Vec_Int_t *)");
      }
      Vec_WecFree(p);
      return p_00;
    }
    pVVar5 = Vec_WecEntry(p,iVar11);
    qsort(pVVar5->pArray,(long)(pVVar5->nSize / 3),0xc,Gia_PolynGetResultCompare);
    for (iVar3 = 0; iVar3 + 2 < pVVar5->nSize; iVar3 = iVar3 + 3) {
      iVar4 = Vec_IntEntry(pVVar5,iVar3);
      i = Vec_IntEntry(pVVar5,iVar3 + 1);
      Vec_IntEntry(pVVar5,iVar3 + 2);
      pVVar6 = Hsh_VecReadEntry(pHashC,iVar4);
      Vec_IntCheckUniqueOrderAbs(pVVar6);
      pVVar7 = Vec_WecPushLevel(p_00);
      Vec_IntGrow(pVVar7,pVVar6->nSize);
      Vec_IntAppend(pVVar7,pVVar6);
      pVVar6 = Hsh_VecReadEntry(pHashM,i);
      lVar8 = 1;
      while (lVar8 < pVVar6->nSize) {
        lVar2 = lVar8 + -1;
        piVar1 = pVVar6->pArray + lVar8;
        lVar8 = lVar8 + 1;
        if (*piVar1 <= pVVar6->pArray[lVar2]) {
          __assert_fail("p->pArray[i-1] < p->pArray[i]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecPo.c"
                        ,0xf5,"void Vec_IntCheckUniqueOrder(Vec_Int_t *)");
        }
      }
      pVVar7 = Vec_WecPushLevel(p_00);
      Vec_IntGrow(pVVar7,pVVar6->nSize);
      Vec_IntAppend(pVVar7,pVVar6);
    }
    iVar11 = iVar11 + 1;
  } while( true );
}

Assistant:

Vec_Wec_t * Gia_PolynGetResult( Hsh_VecMan_t * pHashC, Hsh_VecMan_t * pHashM, Vec_Int_t * vCoefs )
{
    Vec_Int_t * vClass, * vLevel, * vArray;
    Vec_Wec_t * vPolyn, * vSorted;
    int i, k, iConst, iMono, iFirst;
    // find the largest 
    int nLargest = 0, nNonConst = 0;
    Vec_IntForEachEntry( vCoefs, iConst, iMono )
    {
        //Vec_IntPrint( Hsh_VecReadEntry(pHashM, iMono) );
        if ( iConst == 0 ) 
            continue;
        vArray = Hsh_VecReadEntry( pHashC, iConst );
        nLargest = Abc_MaxInt( nLargest, Abc_AbsInt(Vec_IntEntry(vArray, 0)) );
        nNonConst++;
    }
    // sort by the size of the largest coefficient
    vSorted = Vec_WecStart( nLargest+1 );
    Vec_IntForEachEntry( vCoefs, iConst, iMono )
    {
        if ( iConst == 0 ) 
            continue;
        vArray = Hsh_VecReadEntry( pHashC, iConst );
        vLevel = Vec_WecEntry( vSorted, Abc_AbsInt(Vec_IntEntry(vArray, 0)) );
        vArray = Hsh_VecReadEntry( pHashM, iMono );
        iFirst = Vec_IntSize(vArray) ? Vec_IntEntry(vArray, 0) : -1;
        Vec_IntPushThree( vLevel, iConst, iMono, iFirst );
    }
    // reload in the given order
    vPolyn = Vec_WecAlloc( 2*nNonConst );
    Vec_WecForEachLevel( vSorted, vClass, i )
    {
        // sort monomials by the index of the first variable
        qsort( Vec_IntArray(vClass), (size_t)(Vec_IntSize(vClass)/3), 12, (int (*)(const void *, const void *))Gia_PolynGetResultCompare );
        Vec_IntForEachEntryTriple( vClass, iConst, iMono, iFirst, k )
        {
            vArray = Hsh_VecReadEntry( pHashC, iConst );
            Vec_IntCheckUniqueOrderAbs( vArray );
            vLevel = Vec_WecPushLevel( vPolyn );
            Vec_IntGrow( vLevel, Vec_IntSize(vArray) );
            Vec_IntAppend( vLevel, vArray );

            vArray = Hsh_VecReadEntry( pHashM, iMono );
            Vec_IntCheckUniqueOrder( vArray );
            vLevel = Vec_WecPushLevel( vPolyn );
            Vec_IntGrow( vLevel, Vec_IntSize(vArray) );
            Vec_IntAppend( vLevel, vArray );
        }
    }
    assert( Vec_WecSize(vPolyn) == 2*nNonConst );
    Vec_WecFree( vSorted );
    return vPolyn;
}